

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedSnapshotRecord.cpp
# Opt level: O1

void __thiscall
cali::CompressedSnapshotRecordView::unpack_immediate
          (CompressedSnapshotRecordView *this,size_t n,cali_id_t *attr_vec,Variant *data_vec)

{
  long lVar1;
  uchar *puVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  cali_variant_t cVar8;
  size_t pos;
  size_t local_38;
  
  if (this->m_num_imm < n) {
    n = this->m_num_imm;
  }
  local_38 = this->m_imm_pos + 1;
  if (n != 0) {
    uVar5 = 0;
    do {
      puVar2 = this->m_buffer;
      bVar4 = 0;
      lVar6 = 0;
      uVar7 = 0;
      do {
        if (-1 < (char)puVar2[lVar6 + local_38]) goto LAB_00188359;
        uVar7 = uVar7 | (ulong)(puVar2[lVar6 + local_38] & 0x7f) << (bVar4 & 0x3f);
        lVar6 = lVar6 + 1;
        bVar4 = bVar4 + 7;
      } while (lVar6 != 9);
      lVar6 = 9;
LAB_00188359:
      lVar3 = lVar6 + local_38;
      lVar1 = local_38 + lVar6;
      local_38 = local_38 + lVar6 + 1;
      attr_vec[uVar5] = (ulong)(puVar2[lVar3] & 0x7f) << ((char)lVar6 * '\a' & 0x3fU) | uVar7;
      cVar8 = cali_variant_unpack(puVar2 + lVar1 + 1,&local_38,(_Bool *)0x0);
      data_vec[uVar5].m_v.type_and_size = cVar8.type_and_size;
      data_vec[uVar5].m_v.value.v_uint = (uint64_t)cVar8.value;
      uVar5 = uVar5 + 1;
    } while (uVar5 != n);
  }
  return;
}

Assistant:

void CompressedSnapshotRecordView::unpack_immediate(size_t n, cali_id_t attr_vec[], Variant data_vec[]) const
{
    size_t max = std::min(n, m_num_imm);
    size_t pos = m_imm_pos + 1;

    for (size_t i = 0; i < max; ++i) {
        attr_vec[i] = vldec_u64(m_buffer + pos, &pos);
        data_vec[i] = Variant::unpack(m_buffer + pos, &pos, nullptr);
    }
}